

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall Hospital::Show_Nurses_Timetable(Hospital *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  string *local_1c8;
  int local_144;
  int local_140;
  int j;
  int i;
  allocator local_121;
  string *local_120;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  Hospital *this_local;
  
  j._1_1_ = 1;
  local_120 = local_118;
  days.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &this->Admin_Username;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118," Monday   ",&local_121);
  local_120 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8," Tuesday   ",(allocator *)((long)&i + 3));
  local_120 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8," Wednesday",(allocator *)((long)&i + 2));
  local_120 = local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8," Thursday ",(allocator *)((long)&i + 1));
  local_120 = local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98," Friday   ",(allocator *)&i);
  local_120 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78," Saturday ",(allocator *)((long)&j + 3));
  local_120 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58," Sunday   ",(allocator *)((long)&j + 2));
  j._1_1_ = 0;
  local_38 = (iterator)local_118;
  local_30 = 7;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&j);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&j);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&j);
  local_1c8 = (string *)&local_38;
  do {
    local_1c8 = local_1c8 + -0x20;
    std::__cxx11::string::~string(local_1c8);
  } while (local_1c8 != local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
  std::allocator<char>::~allocator((allocator<char> *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"  8->12  ");
  poVar1 = std::operator<<(poVar1,"  12->16  ");
  poVar1 = std::operator<<(poVar1,"  16->20  ");
  poVar1 = std::operator<<(poVar1,"  20->24  ");
  poVar1 = std::operator<<(poVar1,"  24->4  ");
  poVar1 = std::operator<<(poVar1,"  4->8  ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_140 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size(&Nurses_Timetable_abi_cxx11_);
    if (sVar2 <= (ulong)(long)local_140) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_28,(long)local_140);
    std::operator<<((ostream *)&std::cout,(string *)pvVar3);
    local_144 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&Nurses_Timetable_abi_cxx11_,0);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar4);
      if (sVar2 <= (ulong)(long)local_144) break;
      pvVar4 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&Nurses_Timetable_abi_cxx11_,(long)local_140);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar4,(long)local_144);
      std::operator<<((ostream *)&std::cout,(string *)pvVar3);
      local_144 = local_144 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_140 = local_140 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void Hospital :: Show_Nurses_Timetable() {
    vector< string >days {" Monday   "," Tuesday   "," Wednesday"," Thursday "," Friday   "," Saturday "," Sunday   "};
    cout <<"         "<<"  8->12  "<<"  12->16  "<<"  16->20  "<<"  20->24  "<<"  24->4  "<<"  4->8  "<<endl;
    for (int i = 0; i <Nurses_Timetable.size() ; ++i) {
        cout <<days[i];
        for (int j = 0; j <Nurses_Timetable[0].size() ; ++j) {
            cout <<Nurses_Timetable[i][j];
        }
        cout << endl;
    }
}